

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>::ModeRm
          (ModeState<duckdb::string_t,_duckdb::ModeString> *this,idx_t frame)

{
  size_t sVar1;
  bool bVar2;
  string_t *k;
  mapped_type *pmVar3;
  
  k = GetCell(this,frame);
  pmVar3 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::operator[](this->frequency_map,k);
  sVar1 = pmVar3->count;
  this->nonzero = this->nonzero - (ulong)(sVar1 == 1);
  pmVar3->count = sVar1 - 1;
  if (this->count == sVar1) {
    bVar2 = string_t::StringComparisonOperators::Equals(k,this->mode);
    if (bVar2) {
      this->valid = false;
    }
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}